

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsElasticGear::ChShaftsElasticGear
          (ChShaftsElasticGear *this,shared_ptr<chrono::ChShaft> *mshaftA,
          shared_ptr<chrono::ChShaft> *mshaftB,double mstiffness,double mdamping,double mRa,
          double mratio)

{
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaft,void>
            (local_30,&mshaftA->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaft,void>
            (local_40,&mshaftB->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,(shared_ptr<chrono::ChLoadable> *)local_30,
             (shared_ptr<chrono::ChLoadable> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_01170db0;
  this->stiffness = mstiffness;
  this->damping = mdamping;
  this->rest_phase = 0.0;
  this->Ra = mRa;
  this->ratio = mratio;
  this->contact_force = 0.0;
  return;
}

Assistant:

chrono::ChShaftsElasticGear::ChShaftsElasticGear(
    std::shared_ptr<ChShaft> mshaftA,  ///< shaft A
    std::shared_ptr<ChShaft> mshaftB,  ///< shaft B
    const double mstiffness,           ///< normal stiffness at teeth contact, tangent direction to primitive
    const double mdamping,             ///< normal damping at teeth contact, tangent direction to primitive
    const double mRa,                  ///< primitive radius of the gear on shaft A (the radius of B is not needed)
    const double mratio)
    : ChLoadCustomMultiple(mshaftA, mshaftB),
      stiffness(mstiffness),
      damping(mdamping),
      rest_phase(0.0),
      Ra(mRa),
      ratio(mratio) {
    contact_force = 0.0;
}